

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O3

void __thiscall deqp::egl::anon_unknown_0::PartialUpdateTest::deinit(PartialUpdateTest *this)

{
  GLES2Renderer *pGVar1;
  Library *pLVar2;
  
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  operator_delete(this->m_refRenderer,1);
  this->m_refRenderer = (ReferenceRenderer *)0x0;
  pGVar1 = this->m_gles2Renderer;
  if (pGVar1 != (GLES2Renderer *)0x0) {
    glu::ShaderProgram::~ShaderProgram(&pGVar1->m_glProgram);
  }
  operator_delete(pGVar1,0xe0);
  this->m_gles2Renderer = (GLES2Renderer *)0x0;
  if (this->m_eglContext != (EGLContext)0x0) {
    (*pLVar2->_vptr_Library[0x27])(pLVar2,this->m_eglDisplay,0,0,0);
    (*pLVar2->_vptr_Library[0x13])(pLVar2,this->m_eglDisplay,this->m_eglContext);
    this->m_eglContext = (EGLContext)0x0;
  }
  if (this->m_eglSurface != (EGLSurface)0x0) {
    (*pLVar2->_vptr_Library[0x16])(pLVar2,this->m_eglDisplay);
    this->m_eglSurface = (EGLSurface)0x0;
  }
  if (this->m_eglDisplay != (EGLDisplay)0x0) {
    (*pLVar2->_vptr_Library[0x34])(pLVar2);
    this->m_eglDisplay = (EGLDisplay)0x0;
  }
  if (this->m_window != (NativeWindow *)0x0) {
    (*this->m_window->_vptr_NativeWindow[1])();
  }
  this->m_window = (NativeWindow *)0x0;
  return;
}

Assistant:

void PartialUpdateTest::deinit (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	delete m_refRenderer;
	m_refRenderer = DE_NULL;

	delete m_gles2Renderer;
	m_gles2Renderer = DE_NULL;

	if (m_eglContext != EGL_NO_CONTEXT)
	{
		egl.makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		egl.destroyContext(m_eglDisplay, m_eglContext);
		m_eglContext = EGL_NO_CONTEXT;
	}

	if (m_eglSurface != EGL_NO_SURFACE)
	{
		egl.destroySurface(m_eglDisplay, m_eglSurface);
		m_eglSurface = EGL_NO_SURFACE;
	}

	if (m_eglDisplay != EGL_NO_DISPLAY)
	{
		egl.terminate(m_eglDisplay);
		m_eglDisplay = EGL_NO_DISPLAY;
	}

	delete m_window;
	m_window = DE_NULL;
}